

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall QPDF::Members::Members(Members *this)

{
  _Rb_tree_header *p_Var1;
  InvalidInputSource *__p;
  EncryptionParameters *this_00;
  
  QPDFLogger::defaultLogger();
  this->unique_id = 0;
  ::qpdf::Tokenizer::Tokenizer(&this->tokenizer);
  __p = (InvalidInputSource *)operator_new(0xa8);
  memset(__p,0,0xa8);
  (__p->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__InputSource_002ac8d0;
  std::shared_ptr<InputSource>::shared_ptr<(anonymous_namespace)::InvalidInputSource,void>
            (&this->file,__p);
  (this->last_object_description)._M_dataplus._M_p =
       (pointer)&(this->last_object_description).field_2;
  (this->last_object_description)._M_string_length = 0;
  (this->last_object_description).field_2._M_local_buf[0] = '\0';
  this->max_warnings = 0;
  (this->last_ostream_description).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->last_ostream_description).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   ((long)&(this->last_ostream_description).
           super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 7) = 0;
  this->attempt_recovery = true;
  this->check_mode = false;
  this_00 = (EncryptionParameters *)operator_new(0xe0);
  EncryptionParameters::EncryptionParameters(this_00);
  std::__shared_ptr<QPDF::EncryptionParameters,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDF::EncryptionParameters,void>
            ((__shared_ptr<QPDF::EncryptionParameters,(__gnu_cxx::_Lock_policy)2> *)&this->encp,
             this_00);
  (this->pdf_version)._M_dataplus._M_p = (pointer)&(this->pdf_version).field_2;
  (this->pdf_version)._M_string_length = 0;
  (this->pdf_version).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->xref_table)._M_t._M_impl.super__Rb_tree_header;
  (this->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->xref_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->xref_table_max_id = 0x7ffffffe;
  this->xref_table_max_offset = 0;
  p_Var1 = &(this->deleted_objects)._M_t._M_impl.super__Rb_tree_header;
  (this->deleted_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->deleted_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->deleted_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->deleted_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->deleted_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->obj_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->obj_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->obj_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->obj_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->obj_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->obj_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->resolving)._M_t._M_impl.super__Rb_tree_header;
  (this->resolving)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->resolving)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->resolving)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->resolving)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pageobj_to_pages_pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pageobj_to_pages_pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->pageobj_to_pages_pos)._M_t._M_impl.super__Rb_tree_header;
  this->invalid_page_found = false;
  (this->all_pages).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->all_pages).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->trailer).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->all_pages).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->resolving)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->trailer).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->pageobj_to_pages_pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->pageobj_to_pages_pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->warnings).super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->warnings).super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->warnings).super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->object_copiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->object_copiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->object_copiers)._M_t._M_impl.super__Rb_tree_header;
  (this->pageobj_to_pages_pos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)
   ((long)&(this->pageobj_to_pages_pos)._M_t._M_impl.super__Rb_tree_header._M_node_count + 7) = 0;
  (this->object_copiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->object_copiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->resolved_object_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->resolved_object_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->resolved_object_streams)._M_t._M_impl.super__Rb_tree_header;
  (this->object_copiers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->copied_streams).
  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->copied_streams).
  super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->copied_stream_data_provider = (CopiedStreamDataProvider *)0x0;
  *(undefined8 *)((long)&this->copied_stream_data_provider + 5) = 0;
  (this->resolved_object_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->resolved_object_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->linp).first_page_end = 0;
  (this->linp).npages = 0;
  (this->linp).xref_zero_offset = 0;
  (this->linp).first_page = 0;
  (this->page_offset_hints).nbits_delta_content_length = 0;
  (this->page_offset_hints).nbits_nshared_objects = 0;
  (this->page_offset_hints).nbits_shared_identifier = 0;
  (this->page_offset_hints).nbits_shared_numerator = 0;
  (this->page_offset_hints).nbits_delta_page_length = 0;
  (this->page_offset_hints).min_content_offset = 0;
  (this->page_offset_hints).nbits_delta_content_offset = 0;
  (this->page_offset_hints).min_content_length = 0;
  (this->page_offset_hints).first_page_offset = 0;
  (this->page_offset_hints).nbits_delta_nobjects = 0;
  (this->page_offset_hints).min_page_length = 0;
  (this->page_offset_hints).shared_denominator = 0;
  (this->shared_object_hints).nshared_total = 0;
  (this->shared_object_hints).nbits_nobjects = 0;
  (this->shared_object_hints).min_group_length = 0;
  (this->shared_object_hints).nbits_delta_group_length = 0;
  (this->shared_object_hints).first_shared_offset = 0;
  (this->shared_object_hints).nshared_first_page = 0;
  (this->shared_object_hints).nshared_total = 0;
  (this->c_linp).first_page_end = 0;
  (this->c_linp).npages = 0;
  (this->c_linp).xref_zero_offset = 0;
  (this->c_linp).first_page = 0;
  (this->obj_user_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->obj_user_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->resolved_object_streams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->first_xref_item_offset = 0;
  this->uncompressed_after_compressed = false;
  this->linearization_warnings = false;
  *(undefined8 *)
   ((long)&(this->lindict).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) = 0;
  *(undefined8 *)((long)&(this->linp).file_size + 4) = 0;
  (this->lindict).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->lindict).super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->page_offset_hints).min_nobjects = 0;
  p_Var1 = &(this->obj_user_to_objects)._M_t._M_impl.super__Rb_tree_header;
  (this->linp).H_offset = 0;
  (this->linp).H_length = 0;
  *(undefined8 *)
   ((long)&(this->page_offset_hints).entries.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->page_offset_hints).entries.
           super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->page_offset_hints).entries.
  super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->page_offset_hints).entries.
  super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->shared_object_hints).entries.
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->shared_object_hints).entries.
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->shared_object_hints).entries.
  super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shared_object_hints).entries.
  super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&(this->outline_hints).group_length = 0;
  *(undefined8 *)((long)&(this->c_linp).file_size + 4) = 0;
  (this->outline_hints).first_object_offset = 0;
  (this->outline_hints).nobjects = 0;
  (this->outline_hints).group_length = 0;
  (this->c_page_offset_data).entries.
  super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c_shared_object_data).first_shared_obj = 0;
  (this->c_shared_object_data).nshared_first_page = 0;
  (this->c_shared_object_data).nshared_total = 0;
  (this->c_page_offset_data).entries.
  super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c_page_offset_data).entries.
  super__Vector_base<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c_linp).H_offset = 0;
  (this->c_linp).H_length = 0;
  *(undefined8 *)
   ((long)&(this->c_shared_object_data).entries.
           super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->c_shared_object_data).entries.
           super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->c_shared_object_data).entries.
  super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c_shared_object_data).entries.
  super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&(this->c_outline_data).first_object_offset,0,0x88);
  (this->obj_user_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->obj_user_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->obj_user_to_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->object_to_obj_users)._M_t._M_impl.super__Rb_tree_header;
  (this->object_to_obj_users)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->object_to_obj_users)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->object_to_obj_users)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->object_to_obj_users)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->object_to_obj_users)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

QPDF::Members::Members() :
    log(QPDFLogger::defaultLogger()),
    file(new InvalidInputSource()),
    encp(new EncryptionParameters)
{
}